

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall
caffe::AccuracyParameter::AccuracyParameter(AccuracyParameter *this,AccuracyParameter *from)

{
  void *pvVar1;
  uint32 uVar2;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__AccuracyParameter_0075fef0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->axis_ = from->axis_;
  uVar2 = from->top_k_;
  this->ignore_label_ = from->ignore_label_;
  this->top_k_ = uVar2;
  return;
}

Assistant:

AccuracyParameter::AccuracyParameter(const AccuracyParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&ignore_label_, &from.ignore_label_,
    reinterpret_cast<char*>(&axis_) -
    reinterpret_cast<char*>(&ignore_label_) + sizeof(axis_));
  // @@protoc_insertion_point(copy_constructor:caffe.AccuracyParameter)
}